

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

bool __thiscall mkvparser::VideoTrack::VetEntry(VideoTrack *this,BlockEntry *pBlockEntry)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  iVar2 = (*pBlockEntry->_vptr_BlockEntry[2])(pBlockEntry);
  if ((CONCAT44(extraout_var,iVar2) == 0) ||
     (*(long *)(CONCAT44(extraout_var,iVar2) + 0x10) != (this->super_Track).m_info.number)) {
    bVar1 = false;
  }
  else {
    iVar2 = (*pBlockEntry->_vptr_BlockEntry[2])(pBlockEntry);
    bVar1 = (bool)(*(byte *)(CONCAT44(extraout_var_00,iVar2) + 0x1a) >> 7);
  }
  return bVar1;
}

Assistant:

bool VideoTrack::VetEntry(const BlockEntry* pBlockEntry) const {
  return Track::VetEntry(pBlockEntry) && pBlockEntry->GetBlock()->IsKey();
}